

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verstring.c
# Opt level: O0

void ssh_verstring_send(ssh_verstring_state *s)

{
  size_t sVar1;
  bufchain *ch;
  LogContext *ctx;
  _Bool _Var2;
  char *pcVar3;
  size_t sVar4;
  char *pcStack_20;
  int sv_pos;
  char *p;
  BinaryPacketProtocol *bpp;
  ssh_verstring_state *s_local;
  
  pcVar3 = dupprintf("%.*s%s-%s%s",(s->prefix_wanted).len & 0xffffffff,(s->prefix_wanted).ptr,
                     s->our_protoversion,s->impl_name,"-Unidentified-Local-Build");
  s->our_vstring = pcVar3;
  sVar1 = (s->prefix_wanted).len;
  sVar4 = strlen(s->our_protoversion);
  for (pcStack_20 = s->our_vstring + ((int)sVar1 + (int)sVar4 + 1); *pcStack_20 != '\0';
      pcStack_20 = pcStack_20 + 1) {
    if ((*pcStack_20 == '-') || (*pcStack_20 == ' ')) {
      *pcStack_20 = '_';
    }
  }
  ch = (s->bpp).out_raw;
  pcVar3 = s->our_vstring;
  sVar4 = strlen(s->our_vstring);
  bufchain_add(ch,pcVar3,sVar4);
  _Var2 = ssh_version_includes_v2(s->our_protoversion);
  if (_Var2) {
    bufchain_add((s->bpp).out_raw,"\r",1);
  }
  bufchain_add((s->bpp).out_raw,"\n",1);
  ctx = (s->bpp).logctx;
  pcVar3 = dupprintf("We claim version: %s",s->our_vstring);
  logevent_and_free(ctx,pcVar3);
  return;
}

Assistant:

static void ssh_verstring_send(struct ssh_verstring_state *s)
{
    BinaryPacketProtocol *bpp = &s->bpp; /* for bpp_logevent */
    char *p;
    int sv_pos;

    /*
     * Construct our outgoing version string.
     */
    s->our_vstring = dupprintf(
        "%.*s%s-%s%s",
        (int)s->prefix_wanted.len, (const char *)s->prefix_wanted.ptr,
        s->our_protoversion, s->impl_name, sshver);
    sv_pos = s->prefix_wanted.len + strlen(s->our_protoversion) + 1;

    /* Convert minus signs and spaces in the software version string
     * into underscores. */
    for (p = s->our_vstring + sv_pos; *p; p++) {
        if (*p == '-' || *p == ' ')
            *p = '_';
    }

#ifdef FUZZING
    /*
     * Replace the first character of the string with an "I" if we're
     * compiling this code for fuzzing - i.e. the protocol prefix
     * becomes "ISH-" instead of "SSH-".
     *
     * This is irrelevant to any real client software (the only thing
     * reading the output of PuTTY built for fuzzing is the fuzzer,
     * which can adapt to whatever it sees anyway). But it's a safety
     * precaution making it difficult to accidentally run such a
     * version of PuTTY (which would be hugely insecure) against a
     * live peer implementation.
     *
     * (So the replacement prefix "ISH" notionally stands for
     * 'Insecure Shell', of course.)
     */
    s->our_vstring[0] = 'I';
#endif

    /*
     * Now send that version string, plus trailing \r\n or just \n
     * (the latter in SSH-1 mode).
     */
    bufchain_add(s->bpp.out_raw, s->our_vstring, strlen(s->our_vstring));
    if (ssh_version_includes_v2(s->our_protoversion))
        bufchain_add(s->bpp.out_raw, "\015", 1);
    bufchain_add(s->bpp.out_raw, "\012", 1);

    bpp_logevent("We claim version: %s", s->our_vstring);
}